

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O1

int __thiscall QByteArray::remove(QByteArray *this,char *__filename)

{
  Data *pDVar1;
  QArrayData *data;
  long in_RDX;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  size_t __n;
  long in_FS_OFFSET;
  QByteArray local_68;
  char *local_50 [4];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < (long)__filename && 0 < in_RDX) {
    pcVar4 = (char *)(this->d).size;
    if (__filename <= pcVar4 && (long)pcVar4 - (long)__filename != 0) {
      lVar2 = (long)pcVar4 - (long)__filename;
      if ((long)(__filename + in_RDX) <= (long)pcVar4) {
        lVar2 = in_RDX;
      }
      pcVar3 = __filename + (long)(this->d).ptr;
      pDVar1 = (this->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i != 1)) {
        local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray(&local_68,(long)pcVar4 - lVar2,(Initialization)in_RDX);
        local_50[0] = (this->d).ptr;
        local_50[1] = pcVar3;
        local_50[2] = pcVar3 + lVar2;
        local_50[3] = local_50[0] + (this->d).size;
        lVar2 = 0;
        pcVar4 = local_68.d.ptr;
        do {
          __n = *(long *)((long)local_50 + lVar2 + 8) - (long)*(void **)((long)local_50 + lVar2);
          if (__n != 0) {
            memmove(pcVar4,*(void **)((long)local_50 + lVar2),__n);
          }
          pcVar4 = pcVar4 + __n;
          lVar2 = lVar2 + 0x10;
        } while (lVar2 != 0x20);
        data = &((this->d).d)->super_QArrayData;
        (this->d).d = local_68.d.d;
        pcVar3 = (this->d).ptr;
        (this->d).ptr = local_68.d.ptr;
        local_68.d.size = (this->d).size;
        (this->d).size = (long)pcVar4 - (long)local_68.d.ptr;
        local_68.d.d = (Data *)data;
        local_68.d.ptr = pcVar3;
        if (data != (QArrayData *)0x0) {
          LOCK();
          (data->ref_)._q_value.super___atomic_base<int>._M_i =
               (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(data,1,0x10);
          }
        }
      }
      else {
        QtPrivate::QPodArrayOps<char>::erase((QPodArrayOps<char> *)this,pcVar3,lVar2);
        (this->d).ptr[(this->d).size] = '\0';
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::remove(qsizetype pos, qsizetype len)
{
    if (len <= 0  || pos < 0 || size_t(pos) >= size_t(size()))
        return *this;
    if (pos + len > d->size)
        len = d->size - pos;

    const auto toRemove_start = d.begin() + pos;
    if (!d->isShared()) {
        d->erase(toRemove_start, len);
        d.data()[d.size] = '\0';
    } else {
        QByteArray copy{size() - len, Qt::Uninitialized};
        copy.d->copyRanges({{d.begin(), toRemove_start},
                           {toRemove_start + len, d.end()}});
        swap(copy);
    }
    return *this;
}